

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast_usingDict
              (char *source,char *dest,int originalSize,char *dictStart,int dictSize)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ushort *puVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  ushort *local_48;
  char *local_40;
  long local_38;
  
  if (dictSize == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = (size_t)dictSize;
    if (dictStart + sVar5 != dest) {
      iVar2 = LZ4_decompress_fast_extDict(source,dest,originalSize,dictStart,sVar5);
      return iVar2;
    }
  }
  pcVar10 = dest + originalSize;
  local_38 = (long)dest - sVar5;
  local_48 = (ushort *)source;
  local_40 = source;
  while( true ) {
    puVar8 = (ushort *)((long)local_48 + 1);
    uVar1 = *local_48;
    uVar6 = (uint)(byte)((byte)uVar1 >> 4);
    uVar7 = (ulong)uVar6;
    local_48 = puVar8;
    if (uVar6 == 0xf) {
      sVar5 = read_long_length_no_check((BYTE **)&local_48);
      uVar7 = sVar5 + 0xf;
    }
    puVar8 = local_48;
    if ((ulong)((long)pcVar10 - (long)dest) < uVar7) {
      return -1;
    }
    memmove(dest,local_48,uVar7);
    pcVar9 = dest + uVar7;
    puVar8 = (ushort *)((long)puVar8 + uVar7);
    if ((ulong)((long)pcVar10 - (long)pcVar9) < 0xc) {
      if (pcVar9 == pcVar10) {
        return (int)puVar8 - (int)local_40;
      }
      return -1;
    }
    uVar7 = (ulong)((byte)uVar1 & 0xf);
    uVar1 = *puVar8;
    local_48 = puVar8 + 1;
    if (uVar7 == 0xf) {
      sVar5 = read_long_length_no_check((BYTE **)&local_48);
      uVar7 = sVar5 + 0xf;
    }
    uVar7 = uVar7 + 4;
    if ((ulong)((long)pcVar10 - (long)pcVar9) < uVar7) break;
    if ((ulong)((long)pcVar9 - local_38) < (ulong)uVar1) {
      return -1;
    }
    pcVar3 = pcVar9;
    uVar4 = uVar7;
    while (bVar11 = uVar4 != 0, uVar4 = uVar4 - 1, bVar11) {
      *pcVar3 = pcVar3[-(ulong)uVar1];
      pcVar3 = pcVar3 + 1;
    }
    dest = pcVar9 + uVar7;
    if ((ulong)((long)pcVar10 - (long)dest) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int LZ4_decompress_fast_usingDict(const char* source, char* dest, int originalSize, const char* dictStart, int dictSize)
{
    if (dictSize==0 || dictStart+dictSize == dest)
        return LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        (size_t)dictSize, NULL, 0);
    assert(dictSize >= 0);
    return LZ4_decompress_fast_extDict(source, dest, originalSize, dictStart, (size_t)dictSize);
}